

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O3

void __thiscall
spdlog::details::T_formatter::format
          (T_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  size_t sVar1;
  ulong uVar2;
  scoped_pad p;
  scoped_pad sStack_38;
  
  scoped_pad::scoped_pad(&sStack_38,8,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2<500ul>(tm_time->tm_hour,dest);
  sVar1 = (dest->super_basic_buffer<char>).size_;
  uVar2 = sVar1 + 1;
  if ((dest->super_basic_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    sVar1 = (dest->super_basic_buffer<char>).size_;
    uVar2 = sVar1 + 1;
  }
  (dest->super_basic_buffer<char>).size_ = uVar2;
  (dest->super_basic_buffer<char>).ptr_[sVar1] = ':';
  fmt_helper::pad2<500ul>(tm_time->tm_min,dest);
  sVar1 = (dest->super_basic_buffer<char>).size_;
  uVar2 = sVar1 + 1;
  if ((dest->super_basic_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    sVar1 = (dest->super_basic_buffer<char>).size_;
    uVar2 = sVar1 + 1;
  }
  (dest->super_basic_buffer<char>).size_ = uVar2;
  (dest->super_basic_buffer<char>).ptr_[sVar1] = ':';
  fmt_helper::pad2<500ul>(tm_time->tm_sec,dest);
  scoped_pad::~scoped_pad(&sStack_38);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 8;
        scoped_pad p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }